

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O3

SXML_CHAR * strcat_alloc(SXML_CHAR **src1,SXML_CHAR *src2)

{
  int iVar1;
  char *pcVar3;
  size_t sVar2;
  
  if ((src1 != (SXML_CHAR **)0x0) && (pcVar3 = *src1, pcVar3 != src2)) {
    if (src2 == (SXML_CHAR *)0x0) {
      return pcVar3;
    }
    if (*src2 == '\0') {
      return pcVar3;
    }
    if (pcVar3 == (char *)0x0) {
      iVar1 = 0;
    }
    else {
      sVar2 = strlen(pcVar3);
      iVar1 = (int)sVar2;
    }
    sVar2 = strlen(src2);
    pcVar3 = (char *)realloc(pcVar3,(long)((int)sVar2 + iVar1 + 1));
    if (pcVar3 != (char *)0x0) {
      if (*src1 == (SXML_CHAR *)0x0) {
        *pcVar3 = '\0';
      }
      *src1 = pcVar3;
      pcVar3 = strcat(pcVar3,src2);
      return pcVar3;
    }
  }
  return (SXML_CHAR *)0x0;
}

Assistant:

SXML_CHAR* strcat_alloc(SXML_CHAR** src1, const SXML_CHAR* src2)
{
	SXML_CHAR* cat;
	int n;

	/* Do not concatenate '*src1' with itself */
	if (src1 == NULL || *src1 == src2)
		return NULL;

	/* Concatenate a NULL or empty string */
	if (src2 == NULL || *src2 == NULC)
		return *src1;

	n = (*src1 == NULL ? 0 : sx_strlen(*src1)) + sx_strlen(src2) + 1;
	cat = __realloc(*src1, n*sizeof(SXML_CHAR));
	if (cat == NULL)
		return NULL;
	if (*src1 == NULL)
		*cat = NULC;
	*src1 = cat;
	sx_strcat(*src1, src2);

	return *src1;
}